

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_OP_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  switch(val) {
  case 3:
    *s_out = "DW_OP_addr";
    s_out_local._4_4_ = 0;
    break;
  default:
    s_out_local._4_4_ = -1;
    break;
  case 6:
    *s_out = "DW_OP_deref";
    s_out_local._4_4_ = 0;
    break;
  case 8:
    *s_out = "DW_OP_const1u";
    s_out_local._4_4_ = 0;
    break;
  case 9:
    *s_out = "DW_OP_const1s";
    s_out_local._4_4_ = 0;
    break;
  case 10:
    *s_out = "DW_OP_const2u";
    s_out_local._4_4_ = 0;
    break;
  case 0xb:
    *s_out = "DW_OP_const2s";
    s_out_local._4_4_ = 0;
    break;
  case 0xc:
    *s_out = "DW_OP_const4u";
    s_out_local._4_4_ = 0;
    break;
  case 0xd:
    *s_out = "DW_OP_const4s";
    s_out_local._4_4_ = 0;
    break;
  case 0xe:
    *s_out = "DW_OP_const8u";
    s_out_local._4_4_ = 0;
    break;
  case 0xf:
    *s_out = "DW_OP_const8s";
    s_out_local._4_4_ = 0;
    break;
  case 0x10:
    *s_out = "DW_OP_constu";
    s_out_local._4_4_ = 0;
    break;
  case 0x11:
    *s_out = "DW_OP_consts";
    s_out_local._4_4_ = 0;
    break;
  case 0x12:
    *s_out = "DW_OP_dup";
    s_out_local._4_4_ = 0;
    break;
  case 0x13:
    *s_out = "DW_OP_drop";
    s_out_local._4_4_ = 0;
    break;
  case 0x14:
    *s_out = "DW_OP_over";
    s_out_local._4_4_ = 0;
    break;
  case 0x15:
    *s_out = "DW_OP_pick";
    s_out_local._4_4_ = 0;
    break;
  case 0x16:
    *s_out = "DW_OP_swap";
    s_out_local._4_4_ = 0;
    break;
  case 0x17:
    *s_out = "DW_OP_rot";
    s_out_local._4_4_ = 0;
    break;
  case 0x18:
    *s_out = "DW_OP_xderef";
    s_out_local._4_4_ = 0;
    break;
  case 0x19:
    *s_out = "DW_OP_abs";
    s_out_local._4_4_ = 0;
    break;
  case 0x1a:
    *s_out = "DW_OP_and";
    s_out_local._4_4_ = 0;
    break;
  case 0x1b:
    *s_out = "DW_OP_div";
    s_out_local._4_4_ = 0;
    break;
  case 0x1c:
    *s_out = "DW_OP_minus";
    s_out_local._4_4_ = 0;
    break;
  case 0x1d:
    *s_out = "DW_OP_mod";
    s_out_local._4_4_ = 0;
    break;
  case 0x1e:
    *s_out = "DW_OP_mul";
    s_out_local._4_4_ = 0;
    break;
  case 0x1f:
    *s_out = "DW_OP_neg";
    s_out_local._4_4_ = 0;
    break;
  case 0x20:
    *s_out = "DW_OP_not";
    s_out_local._4_4_ = 0;
    break;
  case 0x21:
    *s_out = "DW_OP_or";
    s_out_local._4_4_ = 0;
    break;
  case 0x22:
    *s_out = "DW_OP_plus";
    s_out_local._4_4_ = 0;
    break;
  case 0x23:
    *s_out = "DW_OP_plus_uconst";
    s_out_local._4_4_ = 0;
    break;
  case 0x24:
    *s_out = "DW_OP_shl";
    s_out_local._4_4_ = 0;
    break;
  case 0x25:
    *s_out = "DW_OP_shr";
    s_out_local._4_4_ = 0;
    break;
  case 0x26:
    *s_out = "DW_OP_shra";
    s_out_local._4_4_ = 0;
    break;
  case 0x27:
    *s_out = "DW_OP_xor";
    s_out_local._4_4_ = 0;
    break;
  case 0x28:
    *s_out = "DW_OP_bra";
    s_out_local._4_4_ = 0;
    break;
  case 0x29:
    *s_out = "DW_OP_eq";
    s_out_local._4_4_ = 0;
    break;
  case 0x2a:
    *s_out = "DW_OP_ge";
    s_out_local._4_4_ = 0;
    break;
  case 0x2b:
    *s_out = "DW_OP_gt";
    s_out_local._4_4_ = 0;
    break;
  case 0x2c:
    *s_out = "DW_OP_le";
    s_out_local._4_4_ = 0;
    break;
  case 0x2d:
    *s_out = "DW_OP_lt";
    s_out_local._4_4_ = 0;
    break;
  case 0x2e:
    *s_out = "DW_OP_ne";
    s_out_local._4_4_ = 0;
    break;
  case 0x2f:
    *s_out = "DW_OP_skip";
    s_out_local._4_4_ = 0;
    break;
  case 0x30:
    *s_out = "DW_OP_lit0";
    s_out_local._4_4_ = 0;
    break;
  case 0x31:
    *s_out = "DW_OP_lit1";
    s_out_local._4_4_ = 0;
    break;
  case 0x32:
    *s_out = "DW_OP_lit2";
    s_out_local._4_4_ = 0;
    break;
  case 0x33:
    *s_out = "DW_OP_lit3";
    s_out_local._4_4_ = 0;
    break;
  case 0x34:
    *s_out = "DW_OP_lit4";
    s_out_local._4_4_ = 0;
    break;
  case 0x35:
    *s_out = "DW_OP_lit5";
    s_out_local._4_4_ = 0;
    break;
  case 0x36:
    *s_out = "DW_OP_lit6";
    s_out_local._4_4_ = 0;
    break;
  case 0x37:
    *s_out = "DW_OP_lit7";
    s_out_local._4_4_ = 0;
    break;
  case 0x38:
    *s_out = "DW_OP_lit8";
    s_out_local._4_4_ = 0;
    break;
  case 0x39:
    *s_out = "DW_OP_lit9";
    s_out_local._4_4_ = 0;
    break;
  case 0x3a:
    *s_out = "DW_OP_lit10";
    s_out_local._4_4_ = 0;
    break;
  case 0x3b:
    *s_out = "DW_OP_lit11";
    s_out_local._4_4_ = 0;
    break;
  case 0x3c:
    *s_out = "DW_OP_lit12";
    s_out_local._4_4_ = 0;
    break;
  case 0x3d:
    *s_out = "DW_OP_lit13";
    s_out_local._4_4_ = 0;
    break;
  case 0x3e:
    *s_out = "DW_OP_lit14";
    s_out_local._4_4_ = 0;
    break;
  case 0x3f:
    *s_out = "DW_OP_lit15";
    s_out_local._4_4_ = 0;
    break;
  case 0x40:
    *s_out = "DW_OP_lit16";
    s_out_local._4_4_ = 0;
    break;
  case 0x41:
    *s_out = "DW_OP_lit17";
    s_out_local._4_4_ = 0;
    break;
  case 0x42:
    *s_out = "DW_OP_lit18";
    s_out_local._4_4_ = 0;
    break;
  case 0x43:
    *s_out = "DW_OP_lit19";
    s_out_local._4_4_ = 0;
    break;
  case 0x44:
    *s_out = "DW_OP_lit20";
    s_out_local._4_4_ = 0;
    break;
  case 0x45:
    *s_out = "DW_OP_lit21";
    s_out_local._4_4_ = 0;
    break;
  case 0x46:
    *s_out = "DW_OP_lit22";
    s_out_local._4_4_ = 0;
    break;
  case 0x47:
    *s_out = "DW_OP_lit23";
    s_out_local._4_4_ = 0;
    break;
  case 0x48:
    *s_out = "DW_OP_lit24";
    s_out_local._4_4_ = 0;
    break;
  case 0x49:
    *s_out = "DW_OP_lit25";
    s_out_local._4_4_ = 0;
    break;
  case 0x4a:
    *s_out = "DW_OP_lit26";
    s_out_local._4_4_ = 0;
    break;
  case 0x4b:
    *s_out = "DW_OP_lit27";
    s_out_local._4_4_ = 0;
    break;
  case 0x4c:
    *s_out = "DW_OP_lit28";
    s_out_local._4_4_ = 0;
    break;
  case 0x4d:
    *s_out = "DW_OP_lit29";
    s_out_local._4_4_ = 0;
    break;
  case 0x4e:
    *s_out = "DW_OP_lit30";
    s_out_local._4_4_ = 0;
    break;
  case 0x4f:
    *s_out = "DW_OP_lit31";
    s_out_local._4_4_ = 0;
    break;
  case 0x50:
    *s_out = "DW_OP_reg0";
    s_out_local._4_4_ = 0;
    break;
  case 0x51:
    *s_out = "DW_OP_reg1";
    s_out_local._4_4_ = 0;
    break;
  case 0x52:
    *s_out = "DW_OP_reg2";
    s_out_local._4_4_ = 0;
    break;
  case 0x53:
    *s_out = "DW_OP_reg3";
    s_out_local._4_4_ = 0;
    break;
  case 0x54:
    *s_out = "DW_OP_reg4";
    s_out_local._4_4_ = 0;
    break;
  case 0x55:
    *s_out = "DW_OP_reg5";
    s_out_local._4_4_ = 0;
    break;
  case 0x56:
    *s_out = "DW_OP_reg6";
    s_out_local._4_4_ = 0;
    break;
  case 0x57:
    *s_out = "DW_OP_reg7";
    s_out_local._4_4_ = 0;
    break;
  case 0x58:
    *s_out = "DW_OP_reg8";
    s_out_local._4_4_ = 0;
    break;
  case 0x59:
    *s_out = "DW_OP_reg9";
    s_out_local._4_4_ = 0;
    break;
  case 0x5a:
    *s_out = "DW_OP_reg10";
    s_out_local._4_4_ = 0;
    break;
  case 0x5b:
    *s_out = "DW_OP_reg11";
    s_out_local._4_4_ = 0;
    break;
  case 0x5c:
    *s_out = "DW_OP_reg12";
    s_out_local._4_4_ = 0;
    break;
  case 0x5d:
    *s_out = "DW_OP_reg13";
    s_out_local._4_4_ = 0;
    break;
  case 0x5e:
    *s_out = "DW_OP_reg14";
    s_out_local._4_4_ = 0;
    break;
  case 0x5f:
    *s_out = "DW_OP_reg15";
    s_out_local._4_4_ = 0;
    break;
  case 0x60:
    *s_out = "DW_OP_reg16";
    s_out_local._4_4_ = 0;
    break;
  case 0x61:
    *s_out = "DW_OP_reg17";
    s_out_local._4_4_ = 0;
    break;
  case 0x62:
    *s_out = "DW_OP_reg18";
    s_out_local._4_4_ = 0;
    break;
  case 99:
    *s_out = "DW_OP_reg19";
    s_out_local._4_4_ = 0;
    break;
  case 100:
    *s_out = "DW_OP_reg20";
    s_out_local._4_4_ = 0;
    break;
  case 0x65:
    *s_out = "DW_OP_reg21";
    s_out_local._4_4_ = 0;
    break;
  case 0x66:
    *s_out = "DW_OP_reg22";
    s_out_local._4_4_ = 0;
    break;
  case 0x67:
    *s_out = "DW_OP_reg23";
    s_out_local._4_4_ = 0;
    break;
  case 0x68:
    *s_out = "DW_OP_reg24";
    s_out_local._4_4_ = 0;
    break;
  case 0x69:
    *s_out = "DW_OP_reg25";
    s_out_local._4_4_ = 0;
    break;
  case 0x6a:
    *s_out = "DW_OP_reg26";
    s_out_local._4_4_ = 0;
    break;
  case 0x6b:
    *s_out = "DW_OP_reg27";
    s_out_local._4_4_ = 0;
    break;
  case 0x6c:
    *s_out = "DW_OP_reg28";
    s_out_local._4_4_ = 0;
    break;
  case 0x6d:
    *s_out = "DW_OP_reg29";
    s_out_local._4_4_ = 0;
    break;
  case 0x6e:
    *s_out = "DW_OP_reg30";
    s_out_local._4_4_ = 0;
    break;
  case 0x6f:
    *s_out = "DW_OP_reg31";
    s_out_local._4_4_ = 0;
    break;
  case 0x70:
    *s_out = "DW_OP_breg0";
    s_out_local._4_4_ = 0;
    break;
  case 0x71:
    *s_out = "DW_OP_breg1";
    s_out_local._4_4_ = 0;
    break;
  case 0x72:
    *s_out = "DW_OP_breg2";
    s_out_local._4_4_ = 0;
    break;
  case 0x73:
    *s_out = "DW_OP_breg3";
    s_out_local._4_4_ = 0;
    break;
  case 0x74:
    *s_out = "DW_OP_breg4";
    s_out_local._4_4_ = 0;
    break;
  case 0x75:
    *s_out = "DW_OP_breg5";
    s_out_local._4_4_ = 0;
    break;
  case 0x76:
    *s_out = "DW_OP_breg6";
    s_out_local._4_4_ = 0;
    break;
  case 0x77:
    *s_out = "DW_OP_breg7";
    s_out_local._4_4_ = 0;
    break;
  case 0x78:
    *s_out = "DW_OP_breg8";
    s_out_local._4_4_ = 0;
    break;
  case 0x79:
    *s_out = "DW_OP_breg9";
    s_out_local._4_4_ = 0;
    break;
  case 0x7a:
    *s_out = "DW_OP_breg10";
    s_out_local._4_4_ = 0;
    break;
  case 0x7b:
    *s_out = "DW_OP_breg11";
    s_out_local._4_4_ = 0;
    break;
  case 0x7c:
    *s_out = "DW_OP_breg12";
    s_out_local._4_4_ = 0;
    break;
  case 0x7d:
    *s_out = "DW_OP_breg13";
    s_out_local._4_4_ = 0;
    break;
  case 0x7e:
    *s_out = "DW_OP_breg14";
    s_out_local._4_4_ = 0;
    break;
  case 0x7f:
    *s_out = "DW_OP_breg15";
    s_out_local._4_4_ = 0;
    break;
  case 0x80:
    *s_out = "DW_OP_breg16";
    s_out_local._4_4_ = 0;
    break;
  case 0x81:
    *s_out = "DW_OP_breg17";
    s_out_local._4_4_ = 0;
    break;
  case 0x82:
    *s_out = "DW_OP_breg18";
    s_out_local._4_4_ = 0;
    break;
  case 0x83:
    *s_out = "DW_OP_breg19";
    s_out_local._4_4_ = 0;
    break;
  case 0x84:
    *s_out = "DW_OP_breg20";
    s_out_local._4_4_ = 0;
    break;
  case 0x85:
    *s_out = "DW_OP_breg21";
    s_out_local._4_4_ = 0;
    break;
  case 0x86:
    *s_out = "DW_OP_breg22";
    s_out_local._4_4_ = 0;
    break;
  case 0x87:
    *s_out = "DW_OP_breg23";
    s_out_local._4_4_ = 0;
    break;
  case 0x88:
    *s_out = "DW_OP_breg24";
    s_out_local._4_4_ = 0;
    break;
  case 0x89:
    *s_out = "DW_OP_breg25";
    s_out_local._4_4_ = 0;
    break;
  case 0x8a:
    *s_out = "DW_OP_breg26";
    s_out_local._4_4_ = 0;
    break;
  case 0x8b:
    *s_out = "DW_OP_breg27";
    s_out_local._4_4_ = 0;
    break;
  case 0x8c:
    *s_out = "DW_OP_breg28";
    s_out_local._4_4_ = 0;
    break;
  case 0x8d:
    *s_out = "DW_OP_breg29";
    s_out_local._4_4_ = 0;
    break;
  case 0x8e:
    *s_out = "DW_OP_breg30";
    s_out_local._4_4_ = 0;
    break;
  case 0x8f:
    *s_out = "DW_OP_breg31";
    s_out_local._4_4_ = 0;
    break;
  case 0x90:
    *s_out = "DW_OP_regx";
    s_out_local._4_4_ = 0;
    break;
  case 0x91:
    *s_out = "DW_OP_fbreg";
    s_out_local._4_4_ = 0;
    break;
  case 0x92:
    *s_out = "DW_OP_bregx";
    s_out_local._4_4_ = 0;
    break;
  case 0x93:
    *s_out = "DW_OP_piece";
    s_out_local._4_4_ = 0;
    break;
  case 0x94:
    *s_out = "DW_OP_deref_size";
    s_out_local._4_4_ = 0;
    break;
  case 0x95:
    *s_out = "DW_OP_xderef_size";
    s_out_local._4_4_ = 0;
    break;
  case 0x96:
    *s_out = "DW_OP_nop";
    s_out_local._4_4_ = 0;
    break;
  case 0x97:
    *s_out = "DW_OP_push_object_address";
    s_out_local._4_4_ = 0;
    break;
  case 0x98:
    *s_out = "DW_OP_call2";
    s_out_local._4_4_ = 0;
    break;
  case 0x99:
    *s_out = "DW_OP_call4";
    s_out_local._4_4_ = 0;
    break;
  case 0x9a:
    *s_out = "DW_OP_call_ref";
    s_out_local._4_4_ = 0;
    break;
  case 0x9b:
    *s_out = "DW_OP_form_tls_address";
    s_out_local._4_4_ = 0;
    break;
  case 0x9c:
    *s_out = "DW_OP_call_frame_cfa";
    s_out_local._4_4_ = 0;
    break;
  case 0x9d:
    *s_out = "DW_OP_bit_piece";
    s_out_local._4_4_ = 0;
    break;
  case 0x9e:
    *s_out = "DW_OP_implicit_value";
    s_out_local._4_4_ = 0;
    break;
  case 0x9f:
    *s_out = "DW_OP_stack_value";
    s_out_local._4_4_ = 0;
    break;
  case 0xa0:
    *s_out = "DW_OP_implicit_pointer";
    s_out_local._4_4_ = 0;
    break;
  case 0xa1:
    *s_out = "DW_OP_addrx";
    s_out_local._4_4_ = 0;
    break;
  case 0xa2:
    *s_out = "DW_OP_constx";
    s_out_local._4_4_ = 0;
    break;
  case 0xa3:
    *s_out = "DW_OP_entry_value";
    s_out_local._4_4_ = 0;
    break;
  case 0xa4:
    *s_out = "DW_OP_const_type";
    s_out_local._4_4_ = 0;
    break;
  case 0xa5:
    *s_out = "DW_OP_regval_type";
    s_out_local._4_4_ = 0;
    break;
  case 0xa6:
    *s_out = "DW_OP_deref_type";
    s_out_local._4_4_ = 0;
    break;
  case 0xa7:
    *s_out = "DW_OP_xderef_type";
    s_out_local._4_4_ = 0;
    break;
  case 0xa8:
    *s_out = "DW_OP_convert";
    s_out_local._4_4_ = 0;
    break;
  case 0xa9:
    *s_out = "DW_OP_reinterpret";
    s_out_local._4_4_ = 0;
    break;
  case 0xe0:
    *s_out = "DW_OP_GNU_push_tls_address";
    s_out_local._4_4_ = 0;
    break;
  case 0xe1:
    *s_out = "DW_OP_LLVM_form_aspace_address";
    s_out_local._4_4_ = 0;
    break;
  case 0xe2:
    *s_out = "DW_OP_LLVM_push_lane";
    s_out_local._4_4_ = 0;
    break;
  case 0xe3:
    *s_out = "DW_OP_LLVM_offset";
    s_out_local._4_4_ = 0;
    break;
  case 0xe4:
    *s_out = "DW_OP_LLVM_offset_uconst";
    s_out_local._4_4_ = 0;
    break;
  case 0xe5:
    *s_out = "DW_OP_LLVM_bit_offset";
    s_out_local._4_4_ = 0;
    break;
  case 0xe6:
    *s_out = "DW_OP_LLVM_call_frame_entry_reg";
    s_out_local._4_4_ = 0;
    break;
  case 0xe7:
    *s_out = "DW_OP_LLVM_undefined";
    s_out_local._4_4_ = 0;
    break;
  case 0xe8:
    *s_out = "DW_OP_LLVM_aspace_bregx";
    s_out_local._4_4_ = 0;
    break;
  case 0xe9:
    *s_out = "DW_OP_LLVM_aspace_implicit_pointer";
    s_out_local._4_4_ = 0;
    break;
  case 0xea:
    *s_out = "DW_OP_LLVM_piece_end";
    s_out_local._4_4_ = 0;
    break;
  case 0xeb:
    *s_out = "DW_OP_LLVM_extend";
    s_out_local._4_4_ = 0;
    break;
  case 0xec:
    *s_out = "DW_OP_LLVM_select_bit_piece";
    s_out_local._4_4_ = 0;
    break;
  case 0xed:
    *s_out = "DW_OP_WASM_location";
    s_out_local._4_4_ = 0;
    break;
  case 0xee:
    *s_out = "DW_OP_WASM_location_int";
    s_out_local._4_4_ = 0;
    break;
  case 0xf0:
    *s_out = "DW_OP_GNU_uninit";
    s_out_local._4_4_ = 0;
    break;
  case 0xf1:
    *s_out = "DW_OP_GNU_encoded_addr";
    s_out_local._4_4_ = 0;
    break;
  case 0xf2:
    *s_out = "DW_OP_GNU_implicit_pointer";
    s_out_local._4_4_ = 0;
    break;
  case 0xf3:
    *s_out = "DW_OP_GNU_entry_value";
    s_out_local._4_4_ = 0;
    break;
  case 0xf4:
    *s_out = "DW_OP_GNU_const_type";
    s_out_local._4_4_ = 0;
    break;
  case 0xf5:
    *s_out = "DW_OP_GNU_regval_type";
    s_out_local._4_4_ = 0;
    break;
  case 0xf6:
    *s_out = "DW_OP_GNU_deref_type";
    s_out_local._4_4_ = 0;
    break;
  case 0xf7:
    *s_out = "DW_OP_GNU_convert";
    s_out_local._4_4_ = 0;
    break;
  case 0xf8:
    *s_out = "DW_OP_PGI_omp_thread_num";
    s_out_local._4_4_ = 0;
    break;
  case 0xf9:
    *s_out = "DW_OP_GNU_reinterpret";
    s_out_local._4_4_ = 0;
    break;
  case 0xfa:
    *s_out = "DW_OP_GNU_parameter_ref";
    s_out_local._4_4_ = 0;
    break;
  case 0xfb:
    *s_out = "DW_OP_GNU_addr_index";
    s_out_local._4_4_ = 0;
    break;
  case 0xfc:
    *s_out = "DW_OP_GNU_const_index";
    s_out_local._4_4_ = 0;
    break;
  case 0xfd:
    *s_out = "DW_OP_GNU_variable_value";
    s_out_local._4_4_ = 0;
    break;
  case 0xff:
    *s_out = "DW_OP_hi_user";
    s_out_local._4_4_ = 0;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_OP_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_OP_addr:
        *s_out = "DW_OP_addr";
        return DW_DLV_OK;
    case DW_OP_deref:
        *s_out = "DW_OP_deref";
        return DW_DLV_OK;
    case DW_OP_const1u:
        *s_out = "DW_OP_const1u";
        return DW_DLV_OK;
    case DW_OP_const1s:
        *s_out = "DW_OP_const1s";
        return DW_DLV_OK;
    case DW_OP_const2u:
        *s_out = "DW_OP_const2u";
        return DW_DLV_OK;
    case DW_OP_const2s:
        *s_out = "DW_OP_const2s";
        return DW_DLV_OK;
    case DW_OP_const4u:
        *s_out = "DW_OP_const4u";
        return DW_DLV_OK;
    case DW_OP_const4s:
        *s_out = "DW_OP_const4s";
        return DW_DLV_OK;
    case DW_OP_const8u:
        *s_out = "DW_OP_const8u";
        return DW_DLV_OK;
    case DW_OP_const8s:
        *s_out = "DW_OP_const8s";
        return DW_DLV_OK;
    case DW_OP_constu:
        *s_out = "DW_OP_constu";
        return DW_DLV_OK;
    case DW_OP_consts:
        *s_out = "DW_OP_consts";
        return DW_DLV_OK;
    case DW_OP_dup:
        *s_out = "DW_OP_dup";
        return DW_DLV_OK;
    case DW_OP_drop:
        *s_out = "DW_OP_drop";
        return DW_DLV_OK;
    case DW_OP_over:
        *s_out = "DW_OP_over";
        return DW_DLV_OK;
    case DW_OP_pick:
        *s_out = "DW_OP_pick";
        return DW_DLV_OK;
    case DW_OP_swap:
        *s_out = "DW_OP_swap";
        return DW_DLV_OK;
    case DW_OP_rot:
        *s_out = "DW_OP_rot";
        return DW_DLV_OK;
    case DW_OP_xderef:
        *s_out = "DW_OP_xderef";
        return DW_DLV_OK;
    case DW_OP_abs:
        *s_out = "DW_OP_abs";
        return DW_DLV_OK;
    case DW_OP_and:
        *s_out = "DW_OP_and";
        return DW_DLV_OK;
    case DW_OP_div:
        *s_out = "DW_OP_div";
        return DW_DLV_OK;
    case DW_OP_minus:
        *s_out = "DW_OP_minus";
        return DW_DLV_OK;
    case DW_OP_mod:
        *s_out = "DW_OP_mod";
        return DW_DLV_OK;
    case DW_OP_mul:
        *s_out = "DW_OP_mul";
        return DW_DLV_OK;
    case DW_OP_neg:
        *s_out = "DW_OP_neg";
        return DW_DLV_OK;
    case DW_OP_not:
        *s_out = "DW_OP_not";
        return DW_DLV_OK;
    case DW_OP_or:
        *s_out = "DW_OP_or";
        return DW_DLV_OK;
    case DW_OP_plus:
        *s_out = "DW_OP_plus";
        return DW_DLV_OK;
    case DW_OP_plus_uconst:
        *s_out = "DW_OP_plus_uconst";
        return DW_DLV_OK;
    case DW_OP_shl:
        *s_out = "DW_OP_shl";
        return DW_DLV_OK;
    case DW_OP_shr:
        *s_out = "DW_OP_shr";
        return DW_DLV_OK;
    case DW_OP_shra:
        *s_out = "DW_OP_shra";
        return DW_DLV_OK;
    case DW_OP_xor:
        *s_out = "DW_OP_xor";
        return DW_DLV_OK;
    case DW_OP_bra:
        *s_out = "DW_OP_bra";
        return DW_DLV_OK;
    case DW_OP_eq:
        *s_out = "DW_OP_eq";
        return DW_DLV_OK;
    case DW_OP_ge:
        *s_out = "DW_OP_ge";
        return DW_DLV_OK;
    case DW_OP_gt:
        *s_out = "DW_OP_gt";
        return DW_DLV_OK;
    case DW_OP_le:
        *s_out = "DW_OP_le";
        return DW_DLV_OK;
    case DW_OP_lt:
        *s_out = "DW_OP_lt";
        return DW_DLV_OK;
    case DW_OP_ne:
        *s_out = "DW_OP_ne";
        return DW_DLV_OK;
    case DW_OP_skip:
        *s_out = "DW_OP_skip";
        return DW_DLV_OK;
    case DW_OP_lit0:
        *s_out = "DW_OP_lit0";
        return DW_DLV_OK;
    case DW_OP_lit1:
        *s_out = "DW_OP_lit1";
        return DW_DLV_OK;
    case DW_OP_lit2:
        *s_out = "DW_OP_lit2";
        return DW_DLV_OK;
    case DW_OP_lit3:
        *s_out = "DW_OP_lit3";
        return DW_DLV_OK;
    case DW_OP_lit4:
        *s_out = "DW_OP_lit4";
        return DW_DLV_OK;
    case DW_OP_lit5:
        *s_out = "DW_OP_lit5";
        return DW_DLV_OK;
    case DW_OP_lit6:
        *s_out = "DW_OP_lit6";
        return DW_DLV_OK;
    case DW_OP_lit7:
        *s_out = "DW_OP_lit7";
        return DW_DLV_OK;
    case DW_OP_lit8:
        *s_out = "DW_OP_lit8";
        return DW_DLV_OK;
    case DW_OP_lit9:
        *s_out = "DW_OP_lit9";
        return DW_DLV_OK;
    case DW_OP_lit10:
        *s_out = "DW_OP_lit10";
        return DW_DLV_OK;
    case DW_OP_lit11:
        *s_out = "DW_OP_lit11";
        return DW_DLV_OK;
    case DW_OP_lit12:
        *s_out = "DW_OP_lit12";
        return DW_DLV_OK;
    case DW_OP_lit13:
        *s_out = "DW_OP_lit13";
        return DW_DLV_OK;
    case DW_OP_lit14:
        *s_out = "DW_OP_lit14";
        return DW_DLV_OK;
    case DW_OP_lit15:
        *s_out = "DW_OP_lit15";
        return DW_DLV_OK;
    case DW_OP_lit16:
        *s_out = "DW_OP_lit16";
        return DW_DLV_OK;
    case DW_OP_lit17:
        *s_out = "DW_OP_lit17";
        return DW_DLV_OK;
    case DW_OP_lit18:
        *s_out = "DW_OP_lit18";
        return DW_DLV_OK;
    case DW_OP_lit19:
        *s_out = "DW_OP_lit19";
        return DW_DLV_OK;
    case DW_OP_lit20:
        *s_out = "DW_OP_lit20";
        return DW_DLV_OK;
    case DW_OP_lit21:
        *s_out = "DW_OP_lit21";
        return DW_DLV_OK;
    case DW_OP_lit22:
        *s_out = "DW_OP_lit22";
        return DW_DLV_OK;
    case DW_OP_lit23:
        *s_out = "DW_OP_lit23";
        return DW_DLV_OK;
    case DW_OP_lit24:
        *s_out = "DW_OP_lit24";
        return DW_DLV_OK;
    case DW_OP_lit25:
        *s_out = "DW_OP_lit25";
        return DW_DLV_OK;
    case DW_OP_lit26:
        *s_out = "DW_OP_lit26";
        return DW_DLV_OK;
    case DW_OP_lit27:
        *s_out = "DW_OP_lit27";
        return DW_DLV_OK;
    case DW_OP_lit28:
        *s_out = "DW_OP_lit28";
        return DW_DLV_OK;
    case DW_OP_lit29:
        *s_out = "DW_OP_lit29";
        return DW_DLV_OK;
    case DW_OP_lit30:
        *s_out = "DW_OP_lit30";
        return DW_DLV_OK;
    case DW_OP_lit31:
        *s_out = "DW_OP_lit31";
        return DW_DLV_OK;
    case DW_OP_reg0:
        *s_out = "DW_OP_reg0";
        return DW_DLV_OK;
    case DW_OP_reg1:
        *s_out = "DW_OP_reg1";
        return DW_DLV_OK;
    case DW_OP_reg2:
        *s_out = "DW_OP_reg2";
        return DW_DLV_OK;
    case DW_OP_reg3:
        *s_out = "DW_OP_reg3";
        return DW_DLV_OK;
    case DW_OP_reg4:
        *s_out = "DW_OP_reg4";
        return DW_DLV_OK;
    case DW_OP_reg5:
        *s_out = "DW_OP_reg5";
        return DW_DLV_OK;
    case DW_OP_reg6:
        *s_out = "DW_OP_reg6";
        return DW_DLV_OK;
    case DW_OP_reg7:
        *s_out = "DW_OP_reg7";
        return DW_DLV_OK;
    case DW_OP_reg8:
        *s_out = "DW_OP_reg8";
        return DW_DLV_OK;
    case DW_OP_reg9:
        *s_out = "DW_OP_reg9";
        return DW_DLV_OK;
    case DW_OP_reg10:
        *s_out = "DW_OP_reg10";
        return DW_DLV_OK;
    case DW_OP_reg11:
        *s_out = "DW_OP_reg11";
        return DW_DLV_OK;
    case DW_OP_reg12:
        *s_out = "DW_OP_reg12";
        return DW_DLV_OK;
    case DW_OP_reg13:
        *s_out = "DW_OP_reg13";
        return DW_DLV_OK;
    case DW_OP_reg14:
        *s_out = "DW_OP_reg14";
        return DW_DLV_OK;
    case DW_OP_reg15:
        *s_out = "DW_OP_reg15";
        return DW_DLV_OK;
    case DW_OP_reg16:
        *s_out = "DW_OP_reg16";
        return DW_DLV_OK;
    case DW_OP_reg17:
        *s_out = "DW_OP_reg17";
        return DW_DLV_OK;
    case DW_OP_reg18:
        *s_out = "DW_OP_reg18";
        return DW_DLV_OK;
    case DW_OP_reg19:
        *s_out = "DW_OP_reg19";
        return DW_DLV_OK;
    case DW_OP_reg20:
        *s_out = "DW_OP_reg20";
        return DW_DLV_OK;
    case DW_OP_reg21:
        *s_out = "DW_OP_reg21";
        return DW_DLV_OK;
    case DW_OP_reg22:
        *s_out = "DW_OP_reg22";
        return DW_DLV_OK;
    case DW_OP_reg23:
        *s_out = "DW_OP_reg23";
        return DW_DLV_OK;
    case DW_OP_reg24:
        *s_out = "DW_OP_reg24";
        return DW_DLV_OK;
    case DW_OP_reg25:
        *s_out = "DW_OP_reg25";
        return DW_DLV_OK;
    case DW_OP_reg26:
        *s_out = "DW_OP_reg26";
        return DW_DLV_OK;
    case DW_OP_reg27:
        *s_out = "DW_OP_reg27";
        return DW_DLV_OK;
    case DW_OP_reg28:
        *s_out = "DW_OP_reg28";
        return DW_DLV_OK;
    case DW_OP_reg29:
        *s_out = "DW_OP_reg29";
        return DW_DLV_OK;
    case DW_OP_reg30:
        *s_out = "DW_OP_reg30";
        return DW_DLV_OK;
    case DW_OP_reg31:
        *s_out = "DW_OP_reg31";
        return DW_DLV_OK;
    case DW_OP_breg0:
        *s_out = "DW_OP_breg0";
        return DW_DLV_OK;
    case DW_OP_breg1:
        *s_out = "DW_OP_breg1";
        return DW_DLV_OK;
    case DW_OP_breg2:
        *s_out = "DW_OP_breg2";
        return DW_DLV_OK;
    case DW_OP_breg3:
        *s_out = "DW_OP_breg3";
        return DW_DLV_OK;
    case DW_OP_breg4:
        *s_out = "DW_OP_breg4";
        return DW_DLV_OK;
    case DW_OP_breg5:
        *s_out = "DW_OP_breg5";
        return DW_DLV_OK;
    case DW_OP_breg6:
        *s_out = "DW_OP_breg6";
        return DW_DLV_OK;
    case DW_OP_breg7:
        *s_out = "DW_OP_breg7";
        return DW_DLV_OK;
    case DW_OP_breg8:
        *s_out = "DW_OP_breg8";
        return DW_DLV_OK;
    case DW_OP_breg9:
        *s_out = "DW_OP_breg9";
        return DW_DLV_OK;
    case DW_OP_breg10:
        *s_out = "DW_OP_breg10";
        return DW_DLV_OK;
    case DW_OP_breg11:
        *s_out = "DW_OP_breg11";
        return DW_DLV_OK;
    case DW_OP_breg12:
        *s_out = "DW_OP_breg12";
        return DW_DLV_OK;
    case DW_OP_breg13:
        *s_out = "DW_OP_breg13";
        return DW_DLV_OK;
    case DW_OP_breg14:
        *s_out = "DW_OP_breg14";
        return DW_DLV_OK;
    case DW_OP_breg15:
        *s_out = "DW_OP_breg15";
        return DW_DLV_OK;
    case DW_OP_breg16:
        *s_out = "DW_OP_breg16";
        return DW_DLV_OK;
    case DW_OP_breg17:
        *s_out = "DW_OP_breg17";
        return DW_DLV_OK;
    case DW_OP_breg18:
        *s_out = "DW_OP_breg18";
        return DW_DLV_OK;
    case DW_OP_breg19:
        *s_out = "DW_OP_breg19";
        return DW_DLV_OK;
    case DW_OP_breg20:
        *s_out = "DW_OP_breg20";
        return DW_DLV_OK;
    case DW_OP_breg21:
        *s_out = "DW_OP_breg21";
        return DW_DLV_OK;
    case DW_OP_breg22:
        *s_out = "DW_OP_breg22";
        return DW_DLV_OK;
    case DW_OP_breg23:
        *s_out = "DW_OP_breg23";
        return DW_DLV_OK;
    case DW_OP_breg24:
        *s_out = "DW_OP_breg24";
        return DW_DLV_OK;
    case DW_OP_breg25:
        *s_out = "DW_OP_breg25";
        return DW_DLV_OK;
    case DW_OP_breg26:
        *s_out = "DW_OP_breg26";
        return DW_DLV_OK;
    case DW_OP_breg27:
        *s_out = "DW_OP_breg27";
        return DW_DLV_OK;
    case DW_OP_breg28:
        *s_out = "DW_OP_breg28";
        return DW_DLV_OK;
    case DW_OP_breg29:
        *s_out = "DW_OP_breg29";
        return DW_DLV_OK;
    case DW_OP_breg30:
        *s_out = "DW_OP_breg30";
        return DW_DLV_OK;
    case DW_OP_breg31:
        *s_out = "DW_OP_breg31";
        return DW_DLV_OK;
    case DW_OP_regx:
        *s_out = "DW_OP_regx";
        return DW_DLV_OK;
    case DW_OP_fbreg:
        *s_out = "DW_OP_fbreg";
        return DW_DLV_OK;
    case DW_OP_bregx:
        *s_out = "DW_OP_bregx";
        return DW_DLV_OK;
    case DW_OP_piece:
        *s_out = "DW_OP_piece";
        return DW_DLV_OK;
    case DW_OP_deref_size:
        *s_out = "DW_OP_deref_size";
        return DW_DLV_OK;
    case DW_OP_xderef_size:
        *s_out = "DW_OP_xderef_size";
        return DW_DLV_OK;
    case DW_OP_nop:
        *s_out = "DW_OP_nop";
        return DW_DLV_OK;
    case DW_OP_push_object_address:
        *s_out = "DW_OP_push_object_address";
        return DW_DLV_OK;
    case DW_OP_call2:
        *s_out = "DW_OP_call2";
        return DW_DLV_OK;
    case DW_OP_call4:
        *s_out = "DW_OP_call4";
        return DW_DLV_OK;
    case DW_OP_call_ref:
        *s_out = "DW_OP_call_ref";
        return DW_DLV_OK;
    case DW_OP_form_tls_address:
        *s_out = "DW_OP_form_tls_address";
        return DW_DLV_OK;
    case DW_OP_call_frame_cfa:
        *s_out = "DW_OP_call_frame_cfa";
        return DW_DLV_OK;
    case DW_OP_bit_piece:
        *s_out = "DW_OP_bit_piece";
        return DW_DLV_OK;
    case DW_OP_implicit_value:
        *s_out = "DW_OP_implicit_value";
        return DW_DLV_OK;
    case DW_OP_stack_value:
        *s_out = "DW_OP_stack_value";
        return DW_DLV_OK;
    case DW_OP_implicit_pointer:
        *s_out = "DW_OP_implicit_pointer";
        return DW_DLV_OK;
    case DW_OP_addrx:
        *s_out = "DW_OP_addrx";
        return DW_DLV_OK;
    case DW_OP_constx:
        *s_out = "DW_OP_constx";
        return DW_DLV_OK;
    case DW_OP_entry_value:
        *s_out = "DW_OP_entry_value";
        return DW_DLV_OK;
    case DW_OP_const_type:
        *s_out = "DW_OP_const_type";
        return DW_DLV_OK;
    case DW_OP_regval_type:
        *s_out = "DW_OP_regval_type";
        return DW_DLV_OK;
    case DW_OP_deref_type:
        *s_out = "DW_OP_deref_type";
        return DW_DLV_OK;
    case DW_OP_xderef_type:
        *s_out = "DW_OP_xderef_type";
        return DW_DLV_OK;
    case DW_OP_convert:
        *s_out = "DW_OP_convert";
        return DW_DLV_OK;
    case DW_OP_reinterpret:
        *s_out = "DW_OP_reinterpret";
        return DW_DLV_OK;
    case DW_OP_GNU_push_tls_address:
        *s_out = "DW_OP_GNU_push_tls_address";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0xe0. DW_OP_lo_user */
    /*  Skipping alternate spelling of value
        0xe0. DW_OP_HP_unknown */
    case DW_OP_LLVM_form_aspace_address:
        *s_out = "DW_OP_LLVM_form_aspace_address";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0xe1. DW_OP_HP_is_value */
    case DW_OP_LLVM_push_lane:
        *s_out = "DW_OP_LLVM_push_lane";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0xe2. DW_OP_HP_fltconst4 */
    case DW_OP_LLVM_offset:
        *s_out = "DW_OP_LLVM_offset";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0xe3. DW_OP_HP_fltconst8 */
    case DW_OP_LLVM_offset_uconst:
        *s_out = "DW_OP_LLVM_offset_uconst";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0xe4. DW_OP_HP_mod_range */
    case DW_OP_LLVM_bit_offset:
        *s_out = "DW_OP_LLVM_bit_offset";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0xe5. DW_OP_HP_unmod_range */
    case DW_OP_LLVM_call_frame_entry_reg:
        *s_out = "DW_OP_LLVM_call_frame_entry_reg";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0xe6. DW_OP_HP_tls */
    case DW_OP_LLVM_undefined:
        *s_out = "DW_OP_LLVM_undefined";
        return DW_DLV_OK;
    case DW_OP_LLVM_aspace_bregx:
        *s_out = "DW_OP_LLVM_aspace_bregx";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0xe8. DW_OP_INTEL_bit_piece */
    case DW_OP_LLVM_aspace_implicit_pointer:
        *s_out = "DW_OP_LLVM_aspace_implicit_pointer";
        return DW_DLV_OK;
    case DW_OP_LLVM_piece_end:
        *s_out = "DW_OP_LLVM_piece_end";
        return DW_DLV_OK;
    case DW_OP_LLVM_extend:
        *s_out = "DW_OP_LLVM_extend";
        return DW_DLV_OK;
    case DW_OP_LLVM_select_bit_piece:
        *s_out = "DW_OP_LLVM_select_bit_piece";
        return DW_DLV_OK;
    case DW_OP_WASM_location:
        *s_out = "DW_OP_WASM_location";
        return DW_DLV_OK;
    case DW_OP_WASM_location_int:
        *s_out = "DW_OP_WASM_location_int";
        return DW_DLV_OK;
    case DW_OP_GNU_uninit:
        *s_out = "DW_OP_GNU_uninit";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0xf0. DW_OP_APPLE_uninit */
    case DW_OP_GNU_encoded_addr:
        *s_out = "DW_OP_GNU_encoded_addr";
        return DW_DLV_OK;
    case DW_OP_GNU_implicit_pointer:
        *s_out = "DW_OP_GNU_implicit_pointer";
        return DW_DLV_OK;
    case DW_OP_GNU_entry_value:
        *s_out = "DW_OP_GNU_entry_value";
        return DW_DLV_OK;
    case DW_OP_GNU_const_type:
        *s_out = "DW_OP_GNU_const_type";
        return DW_DLV_OK;
    case DW_OP_GNU_regval_type:
        *s_out = "DW_OP_GNU_regval_type";
        return DW_DLV_OK;
    case DW_OP_GNU_deref_type:
        *s_out = "DW_OP_GNU_deref_type";
        return DW_DLV_OK;
    case DW_OP_GNU_convert:
        *s_out = "DW_OP_GNU_convert";
        return DW_DLV_OK;
    case DW_OP_PGI_omp_thread_num:
        *s_out = "DW_OP_PGI_omp_thread_num";
        return DW_DLV_OK;
    case DW_OP_GNU_reinterpret:
        *s_out = "DW_OP_GNU_reinterpret";
        return DW_DLV_OK;
    case DW_OP_GNU_parameter_ref:
        *s_out = "DW_OP_GNU_parameter_ref";
        return DW_DLV_OK;
    case DW_OP_GNU_addr_index:
        *s_out = "DW_OP_GNU_addr_index";
        return DW_DLV_OK;
    case DW_OP_GNU_const_index:
        *s_out = "DW_OP_GNU_const_index";
        return DW_DLV_OK;
    case DW_OP_GNU_variable_value:
        *s_out = "DW_OP_GNU_variable_value";
        return DW_DLV_OK;
    case DW_OP_hi_user:
        *s_out = "DW_OP_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}